

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

void vepu580_h265_set_hw_address(H265eV580HalContext *ctx,HalEncTask *task)

{
  ushort uVar1;
  Vepu580H265eFrmCfg *pVVar2;
  H265eV580RegSet *pHVar3;
  H265eSyntax_new *pHVar4;
  MppDevRegOffCfgs *pMVar5;
  RK_U32 RVar6;
  uint uVar7;
  hevc_vepu580_base *phVar8;
  HalBuf *pHVar9;
  HalBuf *pHVar10;
  MppBuffer pvVar11;
  size_t sVar12;
  uint local_50;
  RK_U32 max_tile_buf_size;
  RK_U32 i;
  RK_U32 tile_num;
  H265eSyntax_new *syn;
  HalBuf *ref_buf;
  HalBuf *recon_buf;
  HalEncTask *enc_task;
  hevc_vepu580_base *regs;
  Vepu580H265eFrmCfg *frm;
  HalEncTask *task_local;
  H265eV580HalContext *ctx_local;
  
  pVVar2 = ctx->frm;
  pHVar3 = pVVar2->regs_set[0];
  phVar8 = &pHVar3->reg_base;
  pHVar4 = ctx->syn;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0x996);
  }
  RVar6 = mpp_buffer_get_fd_with_caller(task->input,"vepu580_h265_set_hw_address");
  phVar8->reg0160_adr_src0 = RVar6;
  (pHVar3->reg_base).reg0161_adr_src1 = phVar8->reg0160_adr_src0;
  (pHVar3->reg_base).reg0162_adr_src2 = phVar8->reg0160_adr_src0;
  pHVar9 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar2->hal_curr_idx);
  pHVar10 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar2->hal_refr_idx);
  if ((pHVar4->sp).non_reference_flag == 0) {
    RVar6 = mpp_buffer_get_fd_with_caller(*pHVar9->buf,"vepu580_h265_set_hw_address");
    (pHVar3->reg_base).reg0163_rfpw_h_addr = RVar6;
    (pHVar3->reg_base).reg0164_rfpw_b_addr = (pHVar3->reg_base).reg0163_rfpw_h_addr;
    mpp_dev_multi_offset_update(pVVar2->reg_cfg,0xa4,ctx->fbc_header_len);
  }
  RVar6 = mpp_buffer_get_fd_with_caller(*pHVar10->buf,"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0165_rfpr_h_addr = RVar6;
  (pHVar3->reg_base).reg0166_rfpr_b_addr = (pHVar3->reg_base).reg0165_rfpr_h_addr;
  RVar6 = mpp_buffer_get_fd_with_caller(pHVar9->buf[2],"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0167_cmvw_addr = RVar6;
  RVar6 = mpp_buffer_get_fd_with_caller(pHVar10->buf[2],"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0168_cmvr_addr = RVar6;
  RVar6 = mpp_buffer_get_fd_with_caller(pHVar9->buf[1],"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0169_dspw_addr = RVar6;
  RVar6 = mpp_buffer_get_fd_with_caller(pHVar10->buf[1],"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0170_dspr_addr = RVar6;
  mpp_dev_multi_offset_update(pVVar2->reg_cfg,0xa6,ctx->fbc_header_len);
  if (((pHVar4->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1) != 0) {
    uVar7 = ((pHVar4->pp).num_tile_columns_minus1 + 1) * ((pHVar4->pp).num_tile_rows_minus1 + 1);
    uVar1 = (pHVar4->pp).pic_height;
    if (ctx->tile_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (&ctx->tile_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v580",
                 "vepu580_h265_set_hw_address");
    }
    if ((ctx->tile_grp == (MppBufferGroup)0x0) &&
       (_mpp_log_l(2,"hal_h265e_v580","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->tile_grp",
                   "vepu580_h265_set_hw_address",0x9b6), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
      if (pVVar2->hw_tile_buf[local_50] == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (ctx->tile_grp,pVVar2->hw_tile_buf + local_50,
                   (ulong)(((uVar1 + 0x3f & 0xffffffc0) + 0x40) * 0x20),"hal_h265e_v580",
                   "vepu580_h265_set_hw_address");
      }
    }
    if (pVVar2->hw_tile_stream[0] == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (ctx->tile_grp,pVVar2->hw_tile_stream,(ulong)ctx->frame_size / (ulong)uVar7,
                 "hal_h265e_v580","vepu580_h265_set_hw_address");
    }
    if (2 < uVar7) {
      if (pVVar2->hw_tile_stream[1] == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (ctx->tile_grp,pVVar2->hw_tile_stream + 1,(ulong)ctx->frame_size / (ulong)uVar7,
                   "hal_h265e_v580","vepu580_h265_set_hw_address");
      }
      if (pVVar2->hw_tile_stream[2] == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (ctx->tile_grp,pVVar2->hw_tile_stream + 2,(ulong)ctx->frame_size / (ulong)uVar7,
                   "hal_h265e_v580","vepu580_h265_set_hw_address");
      }
    }
    RVar6 = mpp_buffer_get_fd_with_caller(pVVar2->hw_tile_buf[0],"vepu580_h265_set_hw_address");
    (pHVar3->reg_base).reg0176_lpfw_addr = RVar6;
    RVar6 = mpp_buffer_get_fd_with_caller(pVVar2->hw_tile_buf[1],"vepu580_h265_set_hw_address");
    (pHVar3->reg_base).reg0177_lpfr_addr = RVar6;
  }
  if (task->md_info == (MppBuffer)0x0) {
    pvVar11 = vepu580_h265_get_md_info_buf(ctx);
    task->md_info = pvVar11;
  }
  if (task->md_info == (MppBuffer)0x0) {
    (pHVar3->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
         ((uint)(pHVar3->reg_base).reg0192_enc_pic & 0xfffffff7);
    (pHVar3->reg_base).reg0171_meiw_addr = 0;
  }
  else {
    (pHVar3->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
         ((uint)(pHVar3->reg_base).reg0192_enc_pic & 0xfffffff7 | 8);
    RVar6 = mpp_buffer_get_fd_with_caller(task->md_info,"vepu580_h265_set_hw_address");
    (pHVar3->reg_base).reg0171_meiw_addr = RVar6;
  }
  RVar6 = mpp_buffer_get_fd_with_caller(task->output,"vepu580_h265_set_hw_address");
  (pHVar3->reg_base).reg0172_bsbt_addr = RVar6;
  (pHVar3->reg_base).reg0173_bsbb_addr = (pHVar3->reg_base).reg0172_bsbt_addr;
  (pHVar3->reg_base).reg0174_bsbr_addr = (pHVar3->reg_base).reg0172_bsbt_addr;
  (pHVar3->reg_base).reg0175_adr_bsbs = (pHVar3->reg_base).reg0172_bsbt_addr;
  pMVar5 = pVVar2->reg_cfg;
  sVar12 = mpp_packet_get_length(task->packet);
  mpp_dev_multi_offset_update(pMVar5,0xaf,(RK_U32)sVar12);
  pMVar5 = pVVar2->reg_cfg;
  sVar12 = mpp_buffer_get_size_with_caller(task->output,"vepu580_h265_set_hw_address");
  mpp_dev_multi_offset_update(pMVar5,0xac,(RK_U32)sVar12);
  RVar6 = mpp_frame_get_offset_y(task->frame);
  (pHVar3->reg_base).reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)(pHVar3->reg_base).reg0204_pic_ofst & 0xc000ffff | (RVar6 & 0x3fff) << 0x10);
  RVar6 = mpp_frame_get_offset_x(task->frame);
  (pHVar3->reg_base).reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)(pHVar3->reg_base).reg0204_pic_ofst & 0xffffc000 | RVar6 & 0x3fff);
  return;
}

Assistant:

void vepu580_h265_set_hw_address(H265eV580HalContext *ctx, HalEncTask *task)
{
    Vepu580H265eFrmCfg *frm = ctx->frm;
    hevc_vepu580_base *regs = &frm->regs_set[0]->reg_base;
    HalEncTask *enc_task = task;
    HalBuf *recon_buf, *ref_buf;
    H265eSyntax_new *syn = ctx->syn;

    hal_h265e_enter();

    regs->reg0160_adr_src0     = mpp_buffer_get_fd(enc_task->input);
    regs->reg0161_adr_src1     = regs->reg0160_adr_src0;
    regs->reg0162_adr_src2     = regs->reg0160_adr_src0;

    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_curr_idx);
    ref_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_refr_idx);

    if (!syn->sp.non_reference_flag) {
        regs->reg0163_rfpw_h_addr  = mpp_buffer_get_fd(recon_buf->buf[0]);
        regs->reg0164_rfpw_b_addr  = regs->reg0163_rfpw_h_addr;

        mpp_dev_multi_offset_update(frm->reg_cfg, 164, ctx->fbc_header_len);
    }
    regs->reg0165_rfpr_h_addr = mpp_buffer_get_fd(ref_buf->buf[0]);
    regs->reg0166_rfpr_b_addr = regs->reg0165_rfpr_h_addr;
    regs->reg0167_cmvw_addr = mpp_buffer_get_fd(recon_buf->buf[2]);
    regs->reg0168_cmvr_addr = mpp_buffer_get_fd(ref_buf->buf[2]);
    regs->reg0169_dspw_addr = mpp_buffer_get_fd(recon_buf->buf[1]);
    regs->reg0170_dspr_addr = mpp_buffer_get_fd(ref_buf->buf[1]);

    mpp_dev_multi_offset_update(frm->reg_cfg, 166, ctx->fbc_header_len);

    if (syn->pp.tiles_enabled_flag) {
        RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
        RK_U32 i = 0;
        RK_U32 max_tile_buf_size = MPP_ALIGN(((MPP_ALIGN(syn->pp.pic_height, 64) + 64) << 5), 256);

        if (NULL == ctx->tile_grp)
            mpp_buffer_group_get_internal(&ctx->tile_grp, MPP_BUFFER_TYPE_ION);

        mpp_assert(ctx->tile_grp);

        for (i = 0; i < MAX_TILE_NUM; i++) {
            if (NULL == frm->hw_tile_buf[i]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_buf[i], max_tile_buf_size);
            }
        }

        if (NULL == frm->hw_tile_stream[0]) {
            mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[0], ctx->frame_size / tile_num);
        }

        if (tile_num > 2) {
            if (NULL == frm->hw_tile_stream[1]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[1], ctx->frame_size / tile_num);
            }
            if (NULL == frm->hw_tile_stream[2]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[2], ctx->frame_size / tile_num);
            }
        }

        regs->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[0]);
        regs->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[1]);
    }

    {
        if (!enc_task->md_info)
            enc_task->md_info = vepu580_h265_get_md_info_buf(ctx);

        if (enc_task->md_info) {
            regs->reg0192_enc_pic.mei_stor    = 1;
            regs->reg0171_meiw_addr = mpp_buffer_get_fd(enc_task->md_info);
        } else {
            regs->reg0192_enc_pic.mei_stor    = 0;
            regs->reg0171_meiw_addr = 0;
        }
    }

    regs->reg0172_bsbt_addr = mpp_buffer_get_fd(enc_task->output);
    /* TODO: stream size relative with syntax */
    regs->reg0173_bsbb_addr = regs->reg0172_bsbt_addr;
    regs->reg0174_bsbr_addr = regs->reg0172_bsbt_addr;
    regs->reg0175_adr_bsbs  = regs->reg0172_bsbt_addr;

    mpp_dev_multi_offset_update(frm->reg_cfg, 175, mpp_packet_get_length(task->packet));
    mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));

    regs->reg0204_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg0204_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
}